

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::ast::ValueExpressionBase::getEffectiveWidthImpl(ValueExpressionBase *this)

{
  SymbolKind SVar1;
  SpecparamSymbol *this_00;
  bitwidth_t bVar2;
  ConstantValue *this_01;
  _Optional_payload_base<unsigned_int> _Var3;
  ulong uVar4;
  ulong uVar5;
  
  this_00 = (SpecparamSymbol *)this->symbol;
  SVar1 = (this_00->super_ValueSymbol).super_Symbol.kind;
  if (SVar1 == EnumValue) {
    this_01 = EnumValueSymbol::getValue
                        ((EnumValueSymbol *)this_00,(this->super_Expression).sourceRange);
  }
  else if (SVar1 == Specparam) {
    this_01 = SpecparamSymbol::getValue(this_00,(this->super_Expression).sourceRange);
  }
  else {
    if (SVar1 != Parameter) {
      bVar2 = Type::getBitWidth((this->super_Expression).type.ptr);
      uVar4 = (ulong)bVar2;
      _Var3._M_payload = (_Storage<unsigned_int,_true>)0x0;
      _Var3._M_engaged = true;
      _Var3._5_3_ = 0;
      uVar5 = 0;
      goto LAB_00441ed6;
    }
    this_01 = ParameterSymbol::getValue
                        ((ParameterSymbol *)this_00,(this->super_Expression).sourceRange);
  }
  _Var3 = (_Optional_payload_base<unsigned_int>)ConstantValue::getEffectiveWidth(this_01);
  uVar5 = (ulong)_Var3 & 0xffffff0000000000;
  uVar4 = (ulong)_Var3 & 0xffffffff;
LAB_00441ed6:
  return (optional<unsigned_int>)(uVar4 | (ulong)_Var3 & 0xff00000000 | uVar5);
}

Assistant:

std::optional<bitwidth_t> ValueExpressionBase::getEffectiveWidthImpl() const {
    switch (symbol.kind) {
        case SymbolKind::Parameter:
            return symbol.as<ParameterSymbol>().getValue(sourceRange).getEffectiveWidth();
        case SymbolKind::EnumValue:
            return symbol.as<EnumValueSymbol>().getValue(sourceRange).getEffectiveWidth();
        case SymbolKind::Specparam:
            return symbol.as<SpecparamSymbol>().getValue(sourceRange).getEffectiveWidth();
        default:
            return type->getBitWidth();
    }
}